

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O2

void h2v1_downsample(j_compress_ptr cinfo,jpeg_component_info *compptr,JSAMPARRAY input_data,
                    JSAMPARRAY output_data)

{
  JDIMENSION JVar1;
  JSAMPROW pJVar2;
  JSAMPROW pJVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  JVar1 = compptr->width_in_blocks;
  expand_right_edge(input_data,cinfo->max_v_samp_factor,cinfo->image_width,JVar1 << 4);
  for (lVar4 = 0; lVar4 < compptr->v_samp_factor; lVar4 = lVar4 + 1) {
    pJVar2 = output_data[lVar4];
    pJVar3 = input_data[lVar4];
    uVar6 = 0;
    for (lVar5 = 0; JVar1 * 8 != (int)lVar5; lVar5 = lVar5 + 1) {
      pJVar2[lVar5] = (JSAMPLE)(pJVar3[lVar5 * 2] + uVar6 + (uint)pJVar3[lVar5 * 2 + 1] >> 1);
      uVar6 = uVar6 ^ 1;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_downsample(j_compress_ptr cinfo, jpeg_component_info *compptr,
                JSAMPARRAY input_data, JSAMPARRAY output_data)
{
  int outrow;
  JDIMENSION outcol;
  JDIMENSION output_cols = compptr->width_in_blocks * DCTSIZE;
  register JSAMPROW inptr, outptr;
  register int bias;

  /* Expand input data enough to let all the output samples be generated
   * by the standard loop.  Special-casing padded output would be more
   * efficient.
   */
  expand_right_edge(input_data, cinfo->max_v_samp_factor, cinfo->image_width,
                    output_cols * 2);

  for (outrow = 0; outrow < compptr->v_samp_factor; outrow++) {
    outptr = output_data[outrow];
    inptr = input_data[outrow];
    bias = 0;                   /* bias = 0,1,0,1,... for successive samples */
    for (outcol = 0; outcol < output_cols; outcol++) {
      *outptr++ = (JSAMPLE)((inptr[0] + inptr[1] + bias) >> 1);
      bias ^= 1;                /* 0=>1, 1=>0 */
      inptr += 2;
    }
  }
}